

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O3

uint * If_CluHashLookup(If_Man_t *p,word *pTruth,int t)

{
  undefined8 *puVar1;
  int nWords;
  long *plVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  Mem_Fixed_t *pMVar6;
  void **ppvVar7;
  uint *puVar8;
  void *pvVar9;
  void **ppvVar10;
  char *pcVar11;
  ulong uVar12;
  long *plVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  char *pcVar17;
  int local_54;
  
  if (p == (If_Man_t *)0x0) {
    puVar8 = (uint *)0x0;
  }
  else {
    iVar5 = p->pPars->nLutSize;
    nWords = 1 << ((char)iVar5 - 6U & 0x1f);
    if (iVar5 < 7) {
      nWords = 1;
    }
    if (p->pMemEntries == (Mem_Fixed_t *)0x0) {
      pMVar6 = Mem_FixedStart(nWords * 8 + 0x10);
      p->pMemEntries = pMVar6;
    }
    ppvVar7 = p->pHashTable[t];
    if (ppvVar7 == (void **)0x0) {
      uVar15 = p->pPars->nCutsMax * p->vObjs->nSize - 1;
      while( true ) {
        do {
          uVar16 = uVar15 + 1;
          uVar3 = uVar15 & 1;
          uVar15 = uVar16;
        } while (uVar3 != 0);
        if (uVar16 < 9) break;
        iVar5 = 5;
        while (uVar16 % (iVar5 - 2U) != 0) {
          uVar3 = iVar5 * iVar5;
          iVar5 = iVar5 + 2;
          if (uVar16 < uVar3) goto LAB_003815f3;
        }
      }
LAB_003815f3:
      iVar5 = p->pPars->nLutSize;
      iVar4 = 1 << ((char)iVar5 - 6U & 0x1f);
      if (iVar5 < 7) {
        iVar4 = 1;
      }
      iVar4 = (int)((1048576000.0 / (double)iVar4) * 0.125);
      iVar5 = uVar16 * 4;
      if (iVar4 <= (int)(uVar16 * 4)) {
        iVar5 = iVar4;
      }
      uVar15 = iVar5 / 2 - 1;
      while( true ) {
        do {
          uVar3 = uVar15 + 1;
          uVar16 = uVar15 & 1;
          uVar15 = uVar3;
        } while (uVar16 != 0);
        if (uVar3 < 9) break;
        iVar5 = 5;
        while (uVar3 % (iVar5 - 2U) != 0) {
          uVar16 = iVar5 * iVar5;
          iVar5 = iVar5 + 2;
          if (uVar3 < uVar16) goto LAB_00381665;
        }
      }
LAB_00381665:
      p->nTableSize[t] = uVar3;
      ppvVar7 = (void **)calloc((long)(int)uVar3,8);
      p->pHashTable[t] = ppvVar7;
    }
    else {
      uVar3 = p->nTableSize[t];
    }
    local_54 = If_CluHashKey(pTruth,nWords,uVar3);
    lVar14 = (long)local_54;
    ppvVar7 = ppvVar7 + lVar14;
    while (ppvVar7 = (void **)*ppvVar7, ppvVar7 != (void **)0x0) {
      iVar5 = bcmp(ppvVar7 + 2,pTruth,(long)nWords << 3);
      if (iVar5 == 0) {
        *(int *)((long)ppvVar7 + 0xc) = *(int *)((long)ppvVar7 + 0xc) + 1;
        return (uint *)(ppvVar7 + 1);
      }
    }
    uVar15 = p->nTableEntries[t];
    if (SBORROW4(uVar15,uVar3 * 2) == (int)(uVar15 + uVar3 * -2) < 0) {
      puVar8 = (uint *)malloc(0x10);
      uVar3 = 8;
      if (6 < uVar15 - 1) {
        uVar3 = uVar15;
      }
      puVar8[1] = 0;
      *puVar8 = uVar3;
      if (uVar3 == 0) {
        pvVar9 = (void *)0x0;
      }
      else {
        pvVar9 = malloc((long)(int)uVar3 << 3);
      }
      *(void **)(puVar8 + 2) = pvVar9;
      iVar5 = If_CluHashFindMedian(p,t);
      uVar12 = (ulong)p->nTableSize[t];
      if ((long)uVar12 < 1) {
        uVar15 = 0;
        memset(p->pHashTable[t],0,uVar12 << 3);
      }
      else {
        lVar14 = 0;
        do {
          pcVar11 = (char *)p->pHashTable[t][lVar14];
          if ((char *)p->pHashTable[t][lVar14] != (char *)0x0) {
            do {
              if (iVar5 < *(int *)(pcVar11 + 0xc)) {
                uVar15 = puVar8[1];
                if (uVar15 == *puVar8) {
                  if ((int)uVar15 < 0x10) {
                    if (*(void **)(puVar8 + 2) == (void *)0x0) {
                      pvVar9 = malloc(0x80);
                    }
                    else {
                      pvVar9 = realloc(*(void **)(puVar8 + 2),0x80);
                    }
                    *(void **)(puVar8 + 2) = pvVar9;
                    *puVar8 = 0x10;
                  }
                  else {
                    if (*(void **)(puVar8 + 2) == (void *)0x0) {
                      pvVar9 = malloc((ulong)uVar15 << 4);
                    }
                    else {
                      pvVar9 = realloc(*(void **)(puVar8 + 2),(ulong)uVar15 << 4);
                    }
                    *(void **)(puVar8 + 2) = pvVar9;
                    *puVar8 = uVar15 * 2;
                  }
                }
                else {
                  pvVar9 = *(void **)(puVar8 + 2);
                }
                puVar8[1] = uVar15 + 1;
                *(char **)((long)pvVar9 + (long)(int)uVar15 * 8) = pcVar11;
                pcVar17 = *(char **)pcVar11;
              }
              else {
                pcVar17 = *(char **)pcVar11;
                Mem_FixedEntryRecycle(p->pMemEntries,pcVar11);
              }
              pcVar11 = pcVar17;
            } while (pcVar17 != (char *)0x0);
            uVar12 = (ulong)(uint)p->nTableSize[t];
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 < (int)uVar12);
        uVar15 = puVar8[1];
        pvVar9 = *(void **)(puVar8 + 2);
        memset(p->pHashTable[t],0,(long)(int)uVar12 << 3);
        if (0 < (long)(int)uVar15) {
          iVar5 = p->nTableSize[t];
          lVar14 = 0;
          do {
            puVar1 = *(undefined8 **)((long)pvVar9 + lVar14 * 8);
            local_54 = If_CluHashKey(puVar1 + 2,nWords,iVar5);
            ppvVar7 = (void **)p->pHashTable[t][local_54];
            if ((ppvVar7 == (void **)0x0) ||
               (*(uint *)((long)ppvVar7 + 0xc) <= *(uint *)((long)puVar1 + 0xc))) {
              *puVar1 = ppvVar7;
              ppvVar10 = p->pHashTable[t] + local_54;
            }
            else {
              do {
                ppvVar10 = ppvVar7;
                ppvVar7 = (void **)*ppvVar10;
                if (ppvVar7 == (void **)0x0) break;
              } while (*(uint *)((long)puVar1 + 0xc) < *(uint *)((long)ppvVar7 + 0xc));
              *puVar1 = ppvVar7;
            }
            *ppvVar10 = puVar1;
            lVar14 = lVar14 + 1;
          } while (lVar14 != (int)uVar15);
        }
      }
      p->nTableEntries[t] = uVar15;
      if (pvVar9 != (void *)0x0) {
        free(pvVar9);
        uVar15 = p->nTableEntries[t];
      }
      free(puVar8);
      lVar14 = (long)local_54;
    }
    p->nTableEntries[t] = uVar15 + 1;
    pcVar11 = Mem_FixedEntryFetch(p->pMemEntries);
    memcpy(pcVar11 + 0x10,pTruth,(long)nWords << 3);
    puVar8 = (uint *)(pcVar11 + 8);
    pcVar11[8] = -1;
    pcVar11[9] = '\0';
    pcVar11[10] = '\0';
    pcVar11[0xb] = '\0';
    pcVar11[0xc] = '\x01';
    pcVar11[0xd] = '\0';
    pcVar11[0xe] = '\0';
    pcVar11[0xf] = '\0';
    pcVar11[0] = '\0';
    pcVar11[1] = '\0';
    pcVar11[2] = '\0';
    pcVar11[3] = '\0';
    pcVar11[4] = '\0';
    pcVar11[5] = '\0';
    pcVar11[6] = '\0';
    pcVar11[7] = '\0';
    plVar2 = (long *)p->pHashTable[t][lVar14];
    do {
      plVar13 = plVar2;
      if (plVar13 == (long *)0x0) {
        p->pHashTable[t][lVar14] = pcVar11;
        return puVar8;
      }
      plVar2 = (long *)*plVar13;
    } while ((long *)*plVar13 != (long *)0x0);
    *plVar13 = (long)pcVar11;
  }
  return puVar8;
}

Assistant:

unsigned * If_CluHashLookup( If_Man_t * p, word * pTruth, int t )
{
    If_Hte_t * pEntry, * pPrev;
    int nWords, HashKey;
    if ( p == NULL )
        return NULL;
    nWords = If_CluWordNum(p->pPars->nLutSize);
    if ( p->pMemEntries == NULL )
        p->pMemEntries = Mem_FixedStart( sizeof(If_Hte_t) + sizeof(word) * (If_CluWordNum(p->pPars->nLutSize) - 1) );
    if ( p->pHashTable[t] == NULL )
    {
        // decide how large should be the table
        int nEntriesMax1 = 4 * If_CluPrimeCudd( Vec_PtrSize(p->vObjs) * p->pPars->nCutsMax );
        int nEntriesMax2 = (int)(((double)CLU_MEM_MAX * (1 << 20)) / If_CluWordNum(p->pPars->nLutSize) / 8);
//        int nEntriesMax2 = 10000;
        // create table
        p->nTableSize[t] = If_CluPrimeCudd( Abc_MinInt(nEntriesMax1, nEntriesMax2)/2 );
        p->pHashTable[t] = ABC_CALLOC( void *, p->nTableSize[t] );
    }
    // check if this entry exists
    HashKey = If_CluHashKey( pTruth, nWords, p->nTableSize[t] );
    for ( pEntry = ((If_Hte_t **)p->pHashTable[t])[HashKey]; pEntry; pEntry = pEntry->pNext )
        if ( memcmp(pEntry->pTruth, pTruth, sizeof(word) * nWords) == 0 )
        {
            pEntry->Counter++;
            return &pEntry->Group;
        }
    // resize the hash table
    if ( p->nTableEntries[t] >= 2 * p->nTableSize[t] )
    {
        // collect useful entries
        If_Hte_t * pPrev;
        Vec_Ptr_t * vUseful = Vec_PtrAlloc( p->nTableEntries[t] );
        int i, Median = If_CluHashFindMedian( p, t );
        for ( i = 0; i < p->nTableSize[t]; i++ )
        {
            for ( pEntry = ((If_Hte_t **)p->pHashTable[t])[i]; pEntry; )
            {
                if ( (int)pEntry->Counter > Median )
                {
                    Vec_PtrPush( vUseful, pEntry );
                    pEntry = pEntry->pNext;
                }
                else
                {
                    pPrev = pEntry->pNext;
                    Mem_FixedEntryRecycle( p->pMemEntries, (char *)pEntry );
                    pEntry = pPrev;
                }
            }
        }
        // add useful entries
        memset( p->pHashTable[t], 0, sizeof(void *) * p->nTableSize[t] );
        Vec_PtrForEachEntry( If_Hte_t *, vUseful, pEntry, i )
        {
            HashKey = If_CluHashKey( pEntry->pTruth, nWords, p->nTableSize[t] );
            pPrev = ((If_Hte_t **)p->pHashTable[t])[HashKey];
            if ( pPrev == NULL || pEntry->Counter >= pPrev->Counter )
            {
                pEntry->pNext = pPrev;
                ((If_Hte_t **)p->pHashTable[t])[HashKey] = pEntry;
            }
            else
            {
                while ( pPrev->pNext && pEntry->Counter < pPrev->pNext->Counter )
                    pPrev = pPrev->pNext;
                pEntry->pNext = pPrev->pNext;
                pPrev->pNext = pEntry;
            }
        }
        p->nTableEntries[t] = Vec_PtrSize( vUseful );
        Vec_PtrFree( vUseful );
    }
    // create entry
    p->nTableEntries[t]++;
    pEntry = (If_Hte_t *)Mem_FixedEntryFetch( p->pMemEntries );
    memcpy( pEntry->pTruth, pTruth, sizeof(word) * nWords );
    pEntry->Group = CLU_UNUSED;
    pEntry->Counter = 1;
    // insert at the beginning
//    pEntry->pNext = ((If_Hte_t **)p->pHashTable[t])[HashKey];
//    ((If_Hte_t **)p->pHashTable[t])[HashKey] = pEntry;
    // insert at the end
    pEntry->pNext = NULL;
    for ( pPrev = ((If_Hte_t **)p->pHashTable[t])[HashKey]; pPrev && pPrev->pNext; pPrev = pPrev->pNext );
    if ( pPrev == NULL )
        ((If_Hte_t **)p->pHashTable[t])[HashKey] = pEntry;
    else
        pPrev->pNext = pEntry;
    return &pEntry->Group;
}